

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O3

size_t __thiscall
llvm::cl::opt<unsigned_int,_false,_llvm::cl::parser<unsigned_int>_>::getOptionWidth
          (opt<unsigned_int,_false,_llvm::cl::parser<unsigned_int>_> *this)

{
  size_t sVar1;
  size_t extraout_RDX;
  size_t sVar2;
  size_t sVar3;
  
  sVar3 = (this->super_Option).ArgStr.Length;
  (**(this->Parser).super_basic_parser<unsigned_int>.super_basic_parser_impl._vptr_basic_parser_impl
  )(&this->Parser);
  if (extraout_RDX != 0) {
    sVar1 = (this->super_Option).ValueStr.Length;
    sVar2 = extraout_RDX;
    if (sVar1 != 0) {
      sVar2 = sVar1;
    }
    sVar3 = sVar2 + (ulong)(((this->super_Option).field_0xd & 4) >> 2) * 3 + sVar3 + 3;
  }
  return sVar3 + 6;
}

Assistant:

size_t getOptionWidth() const override {
    return Parser.getOptionWidth(*this);
  }